

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O0

size_t __thiscall
delaunator::Delaunator::add_triangle
          (Delaunator *this,size_t i0,size_t i1,size_t i2,size_t a,size_t b,size_t c)

{
  char *__from;
  size_t t;
  size_t b_local;
  size_t a_local;
  size_t i2_local;
  size_t i1_local;
  size_t i0_local;
  Delaunator *this_local;
  
  a_local = i2;
  i2_local = i1;
  i1_local = i0;
  i0_local = (size_t)this;
  __from = (char *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             (&this->triangles);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->triangles,&i1_local);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->triangles,&i2_local);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->triangles,&a_local);
  link(this,__from,(char *)a);
  link(this,__from + 1,(char *)b);
  link(this,__from + 2,(char *)c);
  return (size_t)__from;
}

Assistant:

std::size_t Delaunator::add_triangle(
    std::size_t i0,
    std::size_t i1,
    std::size_t i2,
    std::size_t a,
    std::size_t b,
    std::size_t c) {
    std::size_t t = triangles.size();
    triangles.push_back(i0);
    triangles.push_back(i1);
    triangles.push_back(i2);
    link(t, a);
    link(t + 1, b);
    link(t + 2, c);
    return t;
}